

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

int __thiscall Popup::init(Popup *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Popup *this_local;
  Popup *pPVar2;
  
  this->x = this->width;
  this->y = this->height;
  if (this->transition - TRANSITION_SLIDEINBOTTOM < 2) {
    this->x = 0;
    pPVar2 = this;
  }
  else {
    uVar1 = this->transition - TRANSITION_FADE;
    pPVar2 = (Popup *)(ulong)uVar1;
    if (uVar1 == 0) {
      this->alpha = 0.0;
      this->x = 0;
      this->y = 0;
      pPVar2 = this;
    }
  }
  return (int)pPVar2;
}

Assistant:

void Popup::init()
{
	x = width;
	y = height;
	switch(transition)
	{
		case TRANSITION_SLIDEINBOTTOM:
		case TRANSITION_PUSHUP:
			x = 0;
			break;
		case TRANSITION_FADE:
			alpha = 0;
			x = 0;
			y = 0;
			break;
		default:
			break;
	}
}